

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# electron_optimisation_algorithm.cpp
# Opt level: O1

Score __thiscall
indigox::algorithm::ElectronOptimisationAlgorithm::CalculateVertexEnergy
          (ElectronOptimisationAlgorithm *this,ElnVertex *vert)

{
  ElectronOpt *pEVar1;
  ElnVertex pvVar2;
  void *pvVar3;
  void *pvVar4;
  pointer ppVar5;
  pointer ppVar6;
  pointer ppVar7;
  __buckets_ptr pp_Var8;
  ulong uVar9;
  _Hash_node_base *p_Var10;
  byte bVar11;
  __node_base_ptr p_Var12;
  uint uVar13;
  long lVar14;
  ElnVertex pvVar15;
  ElnVertex pvVar16;
  _Rb_tree_node_base *p_Var17;
  ElectronOptimisationAlgorithm *pEVar18;
  _Hash_node_base *p_Var19;
  Score *pSVar20;
  __hash_code __code;
  pointer ppVar21;
  ulong uVar22;
  uint uVar23;
  ElectronOptimisationAlgorithm *pEVar24;
  __node_base_ptr p_Var25;
  __node_base_ptr p_Var26;
  byte bVar27;
  bool bVar28;
  bool bVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  MolVertPair id;
  MolVertPair id_00;
  
  pEVar1 = this->parent_;
  pvVar2 = *vert;
  pvVar3 = *(void **)((long)pvVar2 + 0x30);
  pvVar4 = *(void **)((long)pvVar2 + 0x38);
  ppVar5 = (pEVar1->possibleLocations_).
           super__Vector_base<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar6 = (pEVar1->possibleLocations_).
           super__Vector_base<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar5 == ppVar6) {
    bVar29 = false;
    pEVar24 = this;
  }
  else {
    lVar14 = 0;
    ppVar21 = ppVar5;
    do {
      pEVar24 = (ElectronOptimisationAlgorithm *)
                ((ulong)ppVar21->second ^ (ulong)pvVar4 | (ulong)ppVar21->first ^ (ulong)pvVar3);
      lVar14 = lVar14 + (ulong)(pEVar24 == (ElectronOptimisationAlgorithm *)0x0);
      ppVar21 = ppVar21 + 1;
    } while (ppVar21 != ppVar6);
    bVar29 = lVar14 != 0;
  }
  if (pvVar3 == pvVar4) {
    if ((((Options::AssignElectrons::ALLOW_CHARGED_CARBON) ||
         (*(char *)((long)pvVar2 + 0x45) != '\x06')) || (*(char *)((long)pvVar2 + 0x4a) == '\0')) &&
       ((Options::AssignElectrons::HIGHEST_MAGNITUDE_CHARGE == 0 ||
        (bVar27 = (char)*(byte *)((long)pvVar2 + 0x4a) >> 7,
        (byte)((*(byte *)((long)pvVar2 + 0x4a) ^ bVar27) - bVar27) <=
        Options::AssignElectrons::HIGHEST_MAGNITUDE_CHARGE)))) {
      bVar27 = *(char *)((long)pvVar2 + 0x47) + *(char *)((long)pvVar2 + 0x46);
      pEVar18 = *(ElectronOptimisationAlgorithm **)((long)pvVar2 + 0x18);
      if (pEVar18 == (ElectronOptimisationAlgorithm *)((long)pvVar2 + 8)) {
        bVar28 = false;
      }
      else {
        bVar11 = 1;
        do {
          ppVar7 = (pEVar18->minDistributions_).
                   super__Vector_base<std::pair<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_int>,_std::allocator<std::pair<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          if (ppVar5 != ppVar6) {
            lVar14 = 0;
            ppVar21 = ppVar5;
            do {
              auVar30._0_4_ =
                   -(uint)(*(int *)&ppVar21->first ==
                          *(int *)&ppVar7[1].first.m_bits.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_finish);
              auVar30._4_4_ =
                   -(uint)(*(int *)((long)&ppVar21->first + 4) ==
                          *(int *)((long)&ppVar7[1].first.m_bits.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_finish + 4));
              auVar30._8_4_ =
                   -(uint)(*(int *)&ppVar21->second ==
                          *(int *)&ppVar7[1].first.m_bits.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
              auVar30._12_4_ =
                   -(uint)(*(int *)((long)&ppVar21->second + 4) ==
                          *(int *)((long)&ppVar7[1].first.m_bits.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
              auVar31._4_4_ = auVar30._0_4_;
              auVar31._0_4_ = auVar30._4_4_;
              auVar31._8_4_ = auVar30._12_4_;
              auVar31._12_4_ = auVar30._8_4_;
              uVar13 = movmskpd((int)pEVar24,auVar31 & auVar30);
              pEVar24 = (ElectronOptimisationAlgorithm *)(ulong)uVar13;
              lVar14 = lVar14 + (ulong)(uVar13 == 3);
              ppVar21 = ppVar21 + 1;
            } while (ppVar21 != ppVar6);
            if (lVar14 != 0) {
              bVar11 = 0;
            }
          }
          bVar27 = bVar27 + *(char *)((long)&ppVar7[1].first.m_num_bits + 6) +
                   *(char *)((long)&ppVar7[1].first.m_num_bits + 7);
          pEVar24 = pEVar18;
          pEVar18 = (ElectronOptimisationAlgorithm *)
                    std::_Rb_tree_increment((_Rb_tree_node_base *)pEVar18);
        } while (pEVar18 != (ElectronOptimisationAlgorithm *)((long)pvVar2 + 8));
        bVar28 = (bool)(bVar11 ^ 1);
      }
      if (bVar29 == false && !bVar28) {
        return 0;
      }
      if (((*(ulong *)((long)pvVar2 + 0x28) < 3) || (bVar27 <= *(byte *)((long)pvVar2 + 0x49))) &&
         ((2 < *(ulong *)((long)pvVar2 + 0x28) || (bVar27 <= *(byte *)((long)pvVar2 + 0x48))))) {
        bVar27 = *(byte *)((long)pvVar2 + 0x4a);
        uVar23 = (uint)CONCAT11((bVar27 ^ (char)bVar27 >> 7) - ((char)bVar27 >> 7),
                                *(undefined1 *)((long)pvVar2 + 0x45));
        uVar13 = uVar23 ^ 0x8000;
        if (-1 < (char)bVar27) {
          uVar13 = uVar23;
        }
        uVar9 = (pEVar1->scores_)._M_h._M_bucket_count;
        p_Var26 = (__node_base_ptr)0x0;
        uVar22 = (ulong)uVar13 % uVar9;
        p_Var25 = (pEVar1->scores_)._M_h._M_buckets[uVar22];
        if (p_Var25 != (__node_base_ptr)0x0) {
          uVar23 = *(uint *)&p_Var25->_M_nxt[1]._M_nxt;
          p_Var12 = p_Var25->_M_nxt;
          do {
            p_Var26 = p_Var25;
            if (uVar13 == uVar23) break;
            p_Var19 = p_Var12->_M_nxt;
            if (p_Var19 == (_Hash_node_base *)0x0) goto LAB_0011e864;
            uVar23 = *(uint *)&p_Var19[1]._M_nxt;
            p_Var26 = (__node_base_ptr)0x0;
            p_Var25 = p_Var12;
            p_Var12 = p_Var19;
          } while ((ulong)uVar23 % uVar9 == uVar22);
        }
        goto LAB_0011e867;
      }
    }
  }
  else {
    if ((bVar29 | Options::AssignElectrons::USE_CHARGED_BOND_ENERGIES) != 1) {
      return 0;
    }
    id.second = pvVar3;
    id.first = pvVar3;
    pvVar15 = ElectronGraph::GetVertex
                        ((pEVar1->elnGraph_).
                         super___shared_ptr<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr,id);
    id_00.second = pvVar4;
    id_00.first = pvVar4;
    pvVar16 = ElectronGraph::GetVertex
                        ((this->parent_->elnGraph_).
                         super___shared_ptr<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr,id_00);
    pEVar1 = this->parent_;
    bVar27 = *(char *)((long)pvVar15 + 0x47) + *(char *)((long)pvVar15 + 0x46);
    for (p_Var17 = *(_Rb_tree_node_base **)((long)pvVar15 + 0x18);
        p_Var17 != (_Rb_tree_node_base *)((long)pvVar15 + 8);
        p_Var17 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var17)) {
      bVar27 = bVar27 + *(char *)(*(long *)(p_Var17 + 1) + 0x46) +
               *(char *)(*(long *)(p_Var17 + 1) + 0x47);
    }
    if (((*(ulong *)((long)pvVar15 + 0x28) < 3) || (bVar27 <= *(byte *)((long)pvVar15 + 0x49))) &&
       ((2 < *(ulong *)((long)pvVar15 + 0x28) || (bVar27 <= *(byte *)((long)pvVar15 + 0x48))))) {
      bVar27 = *(char *)((long)pvVar16 + 0x47) + *(char *)((long)pvVar16 + 0x46);
      for (p_Var17 = *(_Rb_tree_node_base **)((long)pvVar16 + 0x18);
          p_Var17 != (_Rb_tree_node_base *)((long)pvVar16 + 8);
          p_Var17 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var17)) {
        bVar27 = bVar27 + *(char *)(*(long *)(p_Var17 + 1) + 0x46) +
                 *(char *)(*(long *)(p_Var17 + 1) + 0x47);
      }
      if (((*(ulong *)((long)pvVar16 + 0x28) < 3) || (bVar27 <= *(byte *)((long)pvVar16 + 0x49))) &&
         ((2 < *(ulong *)((long)pvVar16 + 0x28) || (bVar27 <= *(byte *)((long)pvVar16 + 0x48))))) {
        uVar13 = (uint)CONCAT11(*(undefined1 *)((long)pvVar16 + 0x45),
                                *(undefined1 *)((long)pvVar15 + 0x45));
        if (Options::AssignElectrons::USE_CHARGED_BOND_ENERGIES == true) {
          uVar23 = uVar13 + 0x10000;
          if (*(char *)((long)pvVar15 + 0x4a) == '\0') {
            uVar23 = uVar13;
          }
          if (*(char *)((long)pvVar15 + 0x4a) < '\0') {
            uVar23 = uVar13 + 0x20000;
          }
          if (*(char *)((long)pvVar16 + 0x4a) < '\0') {
            uVar13 = uVar23 | 0x80000;
          }
          else {
            uVar13 = uVar23 + 0x40000;
            if (*(char *)((long)pvVar16 + 0x4a) == '\0') {
              uVar13 = uVar23;
            }
          }
        }
        uVar13 = ((uint)*(byte *)((long)pvVar2 + 0x47) + (uint)*(byte *)((long)pvVar2 + 0x46)) *
                 0x100000 | uVar13;
        pp_Var8 = (pEVar1->scores_)._M_h._M_buckets;
        uVar9 = (pEVar1->scores_)._M_h._M_bucket_count;
        p_Var25 = pp_Var8[(ulong)uVar13 % uVar9];
        p_Var26 = (__node_base_ptr)0x0;
        if ((p_Var25 != (__node_base_ptr)0x0) &&
           (p_Var19 = p_Var25->_M_nxt, p_Var26 = p_Var25,
           uVar13 != *(uint *)&p_Var25->_M_nxt[1]._M_nxt)) {
          while (p_Var25 = p_Var19, p_Var19 = p_Var25->_M_nxt, p_Var19 != (_Hash_node_base *)0x0) {
            p_Var26 = (__node_base_ptr)0x0;
            if (((ulong)*(uint *)&p_Var19[1]._M_nxt % uVar9 != (ulong)uVar13 % uVar9) ||
               (p_Var26 = p_Var25, uVar13 == *(uint *)&p_Var19[1]._M_nxt)) goto LAB_0011e7fb;
          }
          p_Var26 = (__node_base_ptr)0x0;
        }
LAB_0011e7fb:
        if (p_Var26 == (__node_base_ptr)0x0) {
          p_Var19 = (_Hash_node_base *)0x0;
        }
        else {
          p_Var19 = p_Var26->_M_nxt;
        }
        if (p_Var19 == (_Hash_node_base *)0x0) {
          uVar13 = uVar13 & this->eneBitmask_;
          p_Var26 = (__node_base_ptr)0x0;
          uVar22 = (ulong)uVar13 % uVar9;
          p_Var25 = pp_Var8[uVar22 & 0xffffffff];
          if (p_Var25 != (__node_base_ptr)0x0) {
            uVar23 = *(uint *)&p_Var25->_M_nxt[1]._M_nxt;
            p_Var19 = p_Var25->_M_nxt;
            do {
              p_Var26 = p_Var25;
              if (uVar13 == uVar23) break;
              p_Var10 = p_Var19->_M_nxt;
              if (p_Var10 == (_Hash_node_base *)0x0) goto LAB_0011e864;
              uVar23 = *(uint *)&p_Var10[1]._M_nxt;
              p_Var26 = (__node_base_ptr)0x0;
              p_Var25 = p_Var19;
              p_Var19 = p_Var10;
            } while ((ulong)uVar23 % uVar9 == uVar22);
          }
          goto LAB_0011e867;
        }
        goto LAB_0011e894;
      }
    }
  }
LAB_0011e878:
  pSVar20 = &Options::AssignElectrons::INF;
LAB_0011e87f:
  return *pSVar20;
LAB_0011e864:
  p_Var26 = (__node_base_ptr)0x0;
LAB_0011e867:
  if (p_Var26 == (__node_base_ptr)0x0) {
    p_Var19 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var19 = p_Var26->_M_nxt;
  }
  if (p_Var19 != (_Hash_node_base *)0x0) {
LAB_0011e894:
    pSVar20 = (Score *)((long)&p_Var19[1]._M_nxt + 4);
    goto LAB_0011e87f;
  }
  goto LAB_0011e878;
}

Assistant:

Score ElectronOptimisationAlgorithm::CalculateVertexEnergy(ElnVertex& vert) {
  ElnVertProp* prop = parent_->elnGraph_->GetProperties(vert);
  MolVertPair id = prop->id;
  size_t idCount = std::count(parent_->possibleLocations_.begin(),
                              parent_->possibleLocations_.end(), id);
  
  if (id.first == id.second) { // Atom energies
    if (!opt_::ALLOW_CHARGED_CARBON && prop->atomic_number == 6
        && prop->formal_charge != 0) {
      return opt_::INF;
    }
    if (opt_::HIGHEST_MAGNITUDE_CHARGE > 0
        && (size_t)abs(prop->formal_charge) > opt_::HIGHEST_MAGNITUDE_CHARGE) {
      return opt_::INF;
    }
    uint8_t valence = prop->electron_count + prop->pre_placed;
    bool allZero = true;
    ElnNbrsIterPair nbrs = parent_->elnGraph_->GetNeighbours(vert);
    for (ElnNeighboursIter n = nbrs.first; n != nbrs.second; ++n) {
      ElnVertProp* p = parent_->elnGraph_->GetProperties(*n);
      if (std::count(parent_->possibleLocations_.begin(),
                     parent_->possibleLocations_.end(), p->id) != 0) allZero = false;
      valence += p->electron_count + p->pre_placed;
    }
    
    if (idCount == 0 && allZero) return 0;
    
    if ((parent_->elnGraph_->Degree(vert) > 2
         && valence > prop->target_hyper_octet)
        || (parent_->elnGraph_->Degree(vert) <= 2
            && valence > prop->target_octet)){
      return opt_::INF;
    }
    
    
    uint16_t k = prop->atomic_number + (abs(prop->formal_charge) << 8);
    if (prop->formal_charge < 0)
      k += (1 << 15);
    auto pos = parent_->scores_.find(k);
    if (pos == parent_->scores_.end())
      return opt_::INF;
    else
      return pos->second;
    
  } else { // Bond energies
    if (!opt_::USE_CHARGED_BOND_ENERGIES && idCount == 0) return 0;
    ElnVertex u = parent_->elnGraph_->GetVertex(std::make_pair(id.first, id.first));
    ElnVertex v = parent_->elnGraph_->GetVertex(std::make_pair(id.second, id.second));
    ElnVertProp* u_prop = parent_->elnGraph_->GetProperties(u);
    ElnVertProp* v_prop = parent_->elnGraph_->GetProperties(v);
    
    // check valence state of both atoms
    uint8_t valence_u = u_prop->electron_count + u_prop->pre_placed;
    ElnNbrsIterPair nbrs_u = parent_->elnGraph_->GetNeighbours(u);
    for (; nbrs_u.first != nbrs_u.second; ++nbrs_u.first) {
      ElnVertProp* tmpP = parent_->elnGraph_->GetProperties(*nbrs_u.first);
      valence_u += tmpP->electron_count + tmpP->pre_placed;
    }
    if ((parent_->elnGraph_->Degree(u) > 2
         && valence_u > u_prop->target_hyper_octet)
        || (parent_->elnGraph_->Degree(u) <= 2
            && valence_u > u_prop->target_octet)) {
      return opt_::INF;
    }
    
    uint8_t valence_v = v_prop->electron_count + v_prop->pre_placed;
    ElnNbrsIterPair nbrs_v = parent_->elnGraph_->GetNeighbours(v);
    for (; nbrs_v.first != nbrs_v.second; ++nbrs_v.first) {
      ElnVertProp* tmpP = parent_->elnGraph_->GetProperties(*nbrs_v.first);
      valence_v += tmpP->electron_count + tmpP->pre_placed;
    }
    if ((parent_->elnGraph_->Degree(v) > 2
         && valence_v > v_prop->target_hyper_octet)
        || (parent_->elnGraph_->Degree(v) <= 2
            && valence_v > v_prop->target_octet)) {
      return opt_::INF;
    }
    
    uint32_t k = 0;
    k += u_prop->atomic_number;
    k += (v_prop->atomic_number << 8);
    if (opt_::USE_CHARGED_BOND_ENERGIES){
      if (u_prop->formal_charge < 0)
        k += (2 << 16);
      else if (u_prop->formal_charge > 0)
        k += (1 << 16);
      if (v_prop->formal_charge < 0)
        k += (2 << 18);
      else if (v_prop->formal_charge > 0)
        k += (1 << 18);
    }
    k += ((prop->electron_count + prop->pre_placed) << 20);
    
    auto pos = parent_->scores_.find(k);
    
    if (pos != parent_->scores_.end())
      return pos->second;
    
    pos = parent_->scores_.find(k & eneBitmask_);
    if (pos != parent_->scores_.end())
      return pos->second;
    else
      return opt_::INF;
  }
}